

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O1

int QTlsPrivate::X509CertificateOpenSSL::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  QSslCertificate *pQVar1;
  QSslCertificatePrivate *pQVar2;
  char cVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_60;
  QArrayDataPointer<QSslCertificate> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QSslCertificate *)&DAT_aaaaaaaaaaaaaaaa;
  QSslConfiguration::defaultConfiguration();
  QSslConfiguration::caCertificates();
  QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_60);
  cVar3 = QSslSocketPrivate::rootCertOnDemandLoadingSupported();
  if (cVar3 != '\0') {
    QSslSocketPrivate::systemCaCertificates();
    if (local_60.size != 0) {
      if ((local_60.d == (Data *)0x0) ||
         (1 < ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QtPrivate::QCommonArrayOps<QSslCertificate>::growAppend
                  ((QCommonArrayOps<QSslCertificate> *)&local_48,local_60.ptr,
                   local_60.ptr + local_60.size);
      }
      else {
        tbslen = 0;
        QArrayDataPointer<QSslCertificate>::detachAndGrow
                  (&local_48,GrowsAtEnd,local_60.size,(QSslCertificate **)0x0,
                   (QArrayDataPointer<QSslCertificate> *)0x0);
        if ((local_60.size != 0) && (0 < local_60.size)) {
          pQVar1 = local_60.ptr + local_60.size;
          do {
            pQVar2 = ((local_60.ptr)->d).d.ptr;
            ((local_60.ptr)->d).d.ptr = (QSslCertificatePrivate *)0x0;
            local_48.ptr[local_48.size].d.d.ptr = pQVar2;
            local_60.ptr = local_60.ptr + 1;
            local_48.size = local_48.size + 1;
          } while (local_60.ptr < pQVar1);
        }
      }
    }
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_60);
  }
  verify(ctx,(uchar *)&local_48,(size_t)sig,(uchar *)siglen,tbslen);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (int)ctx;
}

Assistant:

QList<QSslError> X509CertificateOpenSSL::verify(const QList<QSslCertificate> &chain,
                                                const QString &hostName)
{
    // This was previously QSslSocketPrivate::verify().
    auto roots = QSslConfiguration::defaultConfiguration().caCertificates();
#ifndef Q_OS_WIN
    // On Windows, system CA certificates are already set as default ones.
    // No need to add them again (and again) and also, if the default configuration
    // has its own set of CAs, this probably should not be amended by the ones
    // from the 'ROOT' store, since it's not what an application chose to trust.
    if (QSslSocketPrivate::rootCertOnDemandLoadingSupported())
        roots.append(QSslSocketPrivate::systemCaCertificates());
#endif // Q_OS_WIN
    return verify(roots, chain, hostName);
}